

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O3

bool __thiscall
ON_ComponentManifestTableIndex::AddSystemItem
          (ON_ComponentManifestTableIndex *this,ON_ComponentManifestItem_PRIVATE *system_item)

{
  Type TVar1;
  uint uVar2;
  ON_ComponentManifestItem_PRIVATE **ppOVar3;
  ON_ComponentManifestItem_PRIVATE *pOVar4;
  
  if ((system_item != (ON_ComponentManifestItem_PRIVATE *)0x0) &&
     (TVar1 = (system_item->super_ON_ComponentManifestItem).m_component_type,
     TVar1 == this->m_component_type)) {
    uVar2 = (system_item->super_ON_ComponentManifestItem).m_index;
    pOVar4 = this->m_first_system_item;
    if ((pOVar4 != (ON_ComponentManifestItem_PRIVATE *)0x0 &
        0x80000001 < uVar2 & this->m_bIndexedComponent) == 1) {
      do {
        if ((pOVar4->super_ON_ComponentManifestItem).m_index == uVar2) goto LAB_003b6338;
        pOVar4 = pOVar4->m_next;
      } while (pOVar4 != (ON_ComponentManifestItem_PRIVATE *)0x0);
    }
    if ((TVar1 != Unset) && (system_item->m_manifest_table_sn == 0)) {
      if (this->m_bIndexedComponent == false) {
        if (uVar2 == 0x80000001) goto LAB_003b6366;
      }
      else if (0x80000001 < uVar2) {
LAB_003b6366:
        pOVar4 = this->m_last_system_item;
        system_item->m_prev = pOVar4;
        system_item->m_next = (ON_ComponentManifestItem_PRIVATE *)0x0;
        ppOVar3 = &pOVar4->m_next;
        if (pOVar4 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
          ppOVar3 = &this->m_first_system_item;
        }
        *ppOVar3 = system_item;
        this->m_last_system_item = system_item;
        this->m_system_item_count = this->m_system_item_count + 1;
        system_item->m_manifest_table_sn = this->m_manifest_table_sn;
        return true;
      }
    }
  }
LAB_003b6338:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive_manifest.cpp"
             ,0xc38,"","Invalid system item parameter.");
  return false;
}

Assistant:

bool ON_ComponentManifestTableIndex::AddSystemItem(
  ON_ComponentManifestItem_PRIVATE* system_item
  )
{
  if ( nullptr != system_item
    && system_item->ComponentType() == m_component_type
    && nullptr == SystemItemFromIndex(system_item->Index())
    && 0 == system_item->m_manifest_table_sn
    && ON_ModelComponent::Type::Unset != m_component_type
    )
  {
    const bool bValidSystemComponentIndex
      = m_bIndexedComponent
      ? (system_item->Index() < 0 && system_item->Index() > ON_UNSET_INT_INDEX)
      : (ON_UNSET_INT_INDEX == system_item->Index());
    if (bValidSystemComponentIndex)
    {
      system_item->m_prev = m_last_system_item;
      system_item->m_next = nullptr;
      if (nullptr != m_last_system_item)
        m_last_system_item->m_next = system_item;
      else
        m_first_system_item = system_item;
      m_last_system_item = system_item;
      m_system_item_count++;
      system_item->m_manifest_table_sn = m_manifest_table_sn;
      return true;
    }
  }
  ON_ERROR("Invalid system item parameter.");
  return false;
}